

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O2

S1ChordAngle __thiscall
S2EdgeTessellator::EstimateMaxError
          (S2EdgeTessellator *this,R2Point *pa,S2Point *a,R2Point *pb,S2Point *b)

{
  Projection *pPVar1;
  double dVar2;
  S1ChordAngle SVar3;
  double extraout_XMM0_Qa;
  S2Point pmid2;
  S2Point mid1;
  S2Point pmid1;
  S2Point mid2;
  S1ChordAngle local_a8;
  S1ChordAngle local_a0;
  VType local_98;
  S2Point local_90;
  S2Point local_78;
  S2Point local_60;
  S2Point local_48;
  
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)a,b);
  local_98 = -1e-14;
  if (dVar2 < -1e-14) {
    SVar3 = S1ChordAngle::Infinity();
    return (S1ChordAngle)SVar3.length2_;
  }
  S2::Interpolate(&local_78,0.31215691082248315,a,b);
  S2::Interpolate(&local_48,0.6878430891775169,a,b);
  pPVar1 = this->proj_;
  (*pPVar1->_vptr_Projection[6])(0x3fd3fa60faccfd31,pPVar1,pa,pb);
  local_90.c_[1] = local_98;
  (*pPVar1->_vptr_Projection[3])(&local_60,pPVar1);
  pPVar1 = this->proj_;
  (*pPVar1->_vptr_Projection[6])(0x3fe602cf82998168,pPVar1,pa,pb);
  local_a0.length2_ = extraout_XMM0_Qa;
  (*pPVar1->_vptr_Projection[3])(&local_90,pPVar1);
  S1ChordAngle::S1ChordAngle(&local_a0,&local_78,&local_60);
  S1ChordAngle::S1ChordAngle(&local_a8,&local_48,&local_90);
  if (local_a8.length2_ <= local_a0.length2_) {
    local_a8.length2_ = local_a0.length2_;
  }
  return (S1ChordAngle)local_a8.length2_;
}

Assistant:

S1ChordAngle S2EdgeTessellator::EstimateMaxError(
    const R2Point& pa, const S2Point& a, const R2Point& pb, const S2Point& b)
    const {
  // See the algorithm description at the top of this file.

  // We always tessellate edges longer than 90 degrees on the sphere, since the
  // approximation below is not robust enough to handle such edges.
  if (a.DotProd(b) < -1e-14) return S1ChordAngle::Infinity();

  constexpr double t1 = kInterpolationFraction;
  constexpr double t2 = 1 - kInterpolationFraction;
  S2Point mid1 = S2::Interpolate(t1, a, b);
  S2Point mid2 = S2::Interpolate(t2, a, b);
  S2Point pmid1 = proj_.Unproject(proj_.Interpolate(t1, pa, pb));
  S2Point pmid2 = proj_.Unproject(proj_.Interpolate(t2, pa, pb));
  return std::max(S1ChordAngle(mid1, pmid1), S1ChordAngle(mid2, pmid2));
}